

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::TapScriptSignData::ConvertFromStruct
          (TapScriptSignData *this,TapScriptSignDataStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->hex_);
  std::__cxx11::string::_M_assign((string *)&this->type_);
  std::__cxx11::string::_M_assign((string *)&this->sighash_type_);
  this->sighash_anyone_can_pay_ = data->sighash_anyone_can_pay;
  this->sighash_rangeproof_ = data->sighash_rangeproof;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void TapScriptSignData::ConvertFromStruct(
    const TapScriptSignDataStruct& data) {
  hex_ = data.hex;
  type_ = data.type;
  sighash_type_ = data.sighash_type;
  sighash_anyone_can_pay_ = data.sighash_anyone_can_pay;
  sighash_rangeproof_ = data.sighash_rangeproof;
  ignore_items = data.ignore_items;
}